

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  bool bVar1;
  char local_71;
  string local_70;
  string local_50;
  
  GetDirectory(&local_70,this,config,artifact);
  local_50._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string,char>(__return_storage_ptr__,&local_70,(char *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildBundleDirectory(&local_50,this,__return_storage_ptr__,config,FullLevel);
    local_71 = '/';
    cmStrCat<std::__cxx11::string,char>(&local_70,&local_50,&local_71);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (artifact == ImportLibraryArtifact) {
    if (realname) {
      NormalGetRealName(&local_70,this,config,ImportLibraryArtifact);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      GetFullName(&local_70,this,config,ImportLibraryArtifact);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  else {
    if (artifact != RuntimeBinaryArtifact) {
      return __return_storage_ptr__;
    }
    if (realname) {
      NormalGetRealName(&local_70,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      GetFullName(&local_70,this,config,RuntimeBinaryArtifact);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      if (realname) {
        fpath +=
          this->NormalGetRealName(config, cmStateEnums::ImportLibraryArtifact);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      }
      break;
  }
  return fpath;
}